

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_inc(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int __fd;
  undefined1 *puVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 *puVar10;
  void *__s1;
  void *__s2;
  ulong uVar11;
  undefined1 *unaff_R12;
  undefined1 *unaff_R13;
  undefined1 *puVar12;
  void *unaff_R14;
  ulong unaff_R15;
  bson_t b;
  bson_error_t error;
  undefined1 auStack_1400 [4];
  uint uStack_13fc;
  undefined1 auStack_1380 [4];
  uint uStack_137c;
  undefined1 auStack_1300 [200];
  undefined1 auStack_1238 [648];
  undefined1 *puStack_fb0;
  undefined1 *puStack_fa8;
  undefined1 *puStack_fa0;
  void *pvStack_f98;
  ulong uStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [4];
  uint uStack_f7c;
  undefined1 auStack_f00 [4];
  uint uStack_efc;
  undefined1 auStack_e38 [648];
  undefined1 *puStack_bb0;
  undefined1 *puStack_ba8;
  undefined1 *puStack_ba0;
  void *pvStack_b98;
  ulong uStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [4];
  uint uStack_b7c;
  undefined1 auStack_b00 [4];
  uint uStack_afc;
  undefined1 auStack_a38 [648];
  undefined1 *puStack_7b0;
  undefined1 *puStack_7a8;
  undefined1 *puStack_7a0;
  void *pvStack_798;
  ulong uStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_700 [4];
  uint uStack_6fc;
  undefined1 auStack_638 [648];
  code *pcStack_388;
  undefined1 auStack_380 [240];
  undefined1 local_290 [648];
  
  pcStack_388 = (code *)0x12fb25;
  cVar1 = bson_init_from_json(auStack_380,"{ \"$inc\" : { \"ref\" : 1 } }",0xffffffffffffffff,
                              local_290);
  if (cVar1 != '\0') {
    pcStack_388 = (code *)0x12fb31;
    bson_destroy(auStack_380);
    return;
  }
  pcStack_388 = test_bson_json_array;
  test_bson_json_inc_cold_1();
  puVar5 = auStack_780;
  puVar12 = auStack_780;
  pcStack_788 = (code *)0x12fb66;
  pcStack_388 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_780);
  pcStack_788 = (code *)0x12fb7c;
  bson_append_int32(auStack_780,"0",1,0);
  pcStack_788 = (code *)0x12fb95;
  bson_append_int32(auStack_780,"1",1,1);
  pcStack_788 = (code *)0x12fbae;
  bson_append_int32(auStack_780,"2",1,2);
  pcStack_788 = (code *)0x12fbc7;
  bson_append_int32(auStack_780,"3",1,3);
  pcStack_788 = (code *)0x12fbea;
  cVar1 = bson_init_from_json(auStack_700,"[ 0, 1, 2, 3 ]",0xffffffffffffffff,auStack_638);
  if (cVar1 != '\0') {
    pcStack_788 = (code *)0x12fc02;
    unaff_R14 = (void *)bson_get_data(auStack_700);
    pcStack_788 = (code *)0x12fc10;
    puVar5 = (undefined1 *)bson_get_data(auStack_780);
    if (uStack_77c == uStack_6fc) {
      pcStack_788 = (code *)0x12fc29;
      pvVar6 = (void *)bson_get_data(auStack_780);
      pcStack_788 = (code *)0x12fc39;
      pvVar7 = (void *)bson_get_data(auStack_700);
      pcStack_788 = (code *)0x12fc48;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_77c);
      if (iVar2 == 0) {
        pcStack_788 = (code *)0x12fc54;
        bson_destroy(auStack_780);
        pcStack_788 = (code *)0x12fc61;
        bson_destroy(auStack_700);
        return;
      }
    }
    unaff_R12 = auStack_700;
    pcStack_788 = (code *)0x12fc82;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_788 = (code *)0x12fc92;
    uVar9 = bson_as_canonical_extended_json(auStack_780,0);
    uVar3 = uStack_77c;
    if (uStack_6fc < uStack_77c) {
      uVar3 = uStack_6fc;
    }
    if (uVar3 != 0) {
      uVar3 = uStack_77c;
      if (uStack_6fc <= uStack_77c) {
        uVar3 = uStack_6fc;
      }
      uVar11 = 0;
      do {
        if (*(char *)((long)unaff_R14 + uVar11) != puVar5[uVar11]) {
          uVar11 = uVar11 & 0xffffffff;
          goto LAB_0012fccd;
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != (uint)uVar11);
    }
    uVar3 = uStack_6fc;
    if (uStack_6fc < uStack_77c) {
      uVar3 = uStack_77c;
    }
    uVar11 = (ulong)(uVar3 - 1);
LAB_0012fccd:
    pcStack_788 = (code *)0x12fceb;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar8,uVar9);
    pcStack_788 = (code *)0x12fd03;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_788 = (code *)0x12fd1e;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012fd6a:
      pcStack_788 = (code *)0x12fd6f;
      test_bson_json_array_cold_6();
LAB_0012fd6f:
      pcStack_788 = (code *)0x12fd74;
      test_bson_json_array_cold_5();
LAB_0012fd74:
      pcStack_788 = (code *)0x12fd79;
      test_bson_json_array_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar12 = auStack_780;
      if (uVar4 == 0xffffffff) goto LAB_0012fd6f;
      puVar12 = (undefined1 *)(ulong)uStack_6fc;
      pcStack_788 = (code *)0x12fd42;
      puVar10 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar12);
      if (puVar10 != puVar12) goto LAB_0012fd74;
      unaff_R14 = (void *)(ulong)uStack_77c;
      pcStack_788 = (code *)0x12fd5a;
      pvVar6 = (void *)write(uVar4,puVar5,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_788 = (code *)0x12fd6a;
        test_bson_json_array_cold_4();
        goto LAB_0012fd6a;
      }
    }
    pcStack_788 = (code *)0x12fd7e;
    test_bson_json_array_cold_3();
    unaff_R13 = puVar12;
  }
  pcStack_788 = test_bson_json_array_single;
  test_bson_json_array_cold_1();
  puVar10 = auStack_b80;
  puVar12 = auStack_b80;
  pcStack_b88 = (code *)0x12fdae;
  puStack_7b0 = puVar5;
  puStack_7a8 = unaff_R12;
  puStack_7a0 = unaff_R13;
  pvStack_798 = unaff_R14;
  uStack_790 = unaff_R15;
  pcStack_788 = (code *)&pcStack_388;
  bson_init(auStack_b80);
  pcStack_b88 = (code *)0x12fdc4;
  bson_append_int32(auStack_b80,"0",1,0);
  pcStack_b88 = (code *)0x12fde7;
  cVar1 = bson_init_from_json(auStack_b00,"[ 0 ]",0xffffffffffffffff,auStack_a38);
  if (cVar1 != '\0') {
    pcStack_b88 = (code *)0x12fdff;
    unaff_R14 = (void *)bson_get_data(auStack_b00);
    pcStack_b88 = (code *)0x12fe0d;
    puVar10 = (undefined1 *)bson_get_data(auStack_b80);
    if (uStack_b7c == uStack_afc) {
      pcStack_b88 = (code *)0x12fe26;
      pvVar6 = (void *)bson_get_data(auStack_b80);
      pcStack_b88 = (code *)0x12fe36;
      pvVar7 = (void *)bson_get_data(auStack_b00);
      pcStack_b88 = (code *)0x12fe45;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_b7c);
      if (iVar2 == 0) {
        pcStack_b88 = (code *)0x12fe51;
        bson_destroy(auStack_b80);
        pcStack_b88 = (code *)0x12fe5e;
        bson_destroy(auStack_b00);
        return;
      }
    }
    unaff_R12 = auStack_b00;
    pcStack_b88 = (code *)0x12fe7f;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_b88 = (code *)0x12fe8f;
    uVar9 = bson_as_canonical_extended_json(auStack_b80,0);
    uVar3 = uStack_b7c;
    if (uStack_afc < uStack_b7c) {
      uVar3 = uStack_afc;
    }
    if (uVar3 != 0) {
      uVar3 = uStack_b7c;
      if (uStack_afc <= uStack_b7c) {
        uVar3 = uStack_afc;
      }
      uVar11 = 0;
      do {
        if (*(char *)((long)unaff_R14 + uVar11) != puVar10[uVar11]) {
          uVar11 = uVar11 & 0xffffffff;
          goto LAB_0012feca;
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != (uint)uVar11);
    }
    uVar3 = uStack_afc;
    if (uStack_afc < uStack_b7c) {
      uVar3 = uStack_b7c;
    }
    uVar11 = (ulong)(uVar3 - 1);
LAB_0012feca:
    pcStack_b88 = (code *)0x12fee8;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar8,uVar9);
    pcStack_b88 = (code *)0x12ff00;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_b88 = (code *)0x12ff1b;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0012ff67:
      pcStack_b88 = (code *)0x12ff6c;
      test_bson_json_array_single_cold_6();
LAB_0012ff6c:
      pcStack_b88 = (code *)0x12ff71;
      test_bson_json_array_single_cold_5();
LAB_0012ff71:
      pcStack_b88 = (code *)0x12ff76;
      test_bson_json_array_single_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar12 = auStack_b80;
      if (uVar4 == 0xffffffff) goto LAB_0012ff6c;
      puVar12 = (undefined1 *)(ulong)uStack_afc;
      pcStack_b88 = (code *)0x12ff3f;
      puVar5 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar12);
      if (puVar5 != puVar12) goto LAB_0012ff71;
      unaff_R14 = (void *)(ulong)uStack_b7c;
      pcStack_b88 = (code *)0x12ff57;
      pvVar6 = (void *)write(uVar4,puVar10,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_b88 = (code *)0x12ff67;
        test_bson_json_array_single_cold_4();
        goto LAB_0012ff67;
      }
    }
    pcStack_b88 = (code *)0x12ff7b;
    test_bson_json_array_single_cold_3();
    unaff_R13 = puVar12;
  }
  pcStack_b88 = test_bson_json_array_int64;
  test_bson_json_array_single_cold_1();
  puVar5 = auStack_f80;
  puVar12 = auStack_f80;
  pcStack_f88 = (code *)0x12ffab;
  puStack_bb0 = puVar10;
  puStack_ba8 = unaff_R12;
  puStack_ba0 = unaff_R13;
  pvStack_b98 = unaff_R14;
  uStack_b90 = unaff_R15;
  pcStack_b88 = (code *)&pcStack_788;
  bson_init(auStack_f80);
  pcStack_f88 = (code *)0x12ffc4;
  bson_append_int64(auStack_f80,"0",1,0x7b);
  pcStack_f88 = (code *)0x12ffdd;
  bson_append_int64(auStack_f80,"1",1,0x2a);
  pcStack_f88 = (code *)0x130000;
  cVar1 = bson_init_from_json(auStack_f00,
                              "[ { \"$numberLong\" : \"123\" },  { \"$numberLong\" : \"42\" } ]",
                              0xffffffffffffffff,auStack_e38);
  puStack_fa0 = unaff_R13;
  if (cVar1 != '\0') {
    pcStack_f88 = (code *)0x130018;
    unaff_R14 = (void *)bson_get_data(auStack_f00);
    pcStack_f88 = (code *)0x130026;
    puVar5 = (undefined1 *)bson_get_data(auStack_f80);
    if (uStack_f7c == uStack_efc) {
      pcStack_f88 = (code *)0x13003f;
      pvVar6 = (void *)bson_get_data(auStack_f80);
      pcStack_f88 = (code *)0x13004f;
      pvVar7 = (void *)bson_get_data(auStack_f00);
      pcStack_f88 = (code *)0x13005e;
      iVar2 = bcmp(pvVar6,pvVar7,(ulong)uStack_f7c);
      if (iVar2 == 0) {
        pcStack_f88 = (code *)0x13006a;
        bson_destroy(auStack_f80);
        pcStack_f88 = (code *)0x130077;
        bson_destroy(auStack_f00);
        return;
      }
    }
    unaff_R12 = auStack_f00;
    pcStack_f88 = (code *)0x130098;
    uVar8 = bson_as_canonical_extended_json(unaff_R12,0);
    pcStack_f88 = (code *)0x1300a8;
    uVar9 = bson_as_canonical_extended_json(auStack_f80,0);
    uVar3 = uStack_f7c;
    if (uStack_efc < uStack_f7c) {
      uVar3 = uStack_efc;
    }
    if (uVar3 != 0) {
      uVar3 = uStack_f7c;
      if (uStack_efc <= uStack_f7c) {
        uVar3 = uStack_efc;
      }
      uVar11 = 0;
      do {
        if (*(char *)((long)unaff_R14 + uVar11) != puVar5[uVar11]) {
          uVar11 = uVar11 & 0xffffffff;
          goto LAB_001300e3;
        }
        uVar11 = uVar11 + 1;
      } while (uVar3 != (uint)uVar11);
    }
    uVar3 = uStack_efc;
    if (uStack_efc < uStack_f7c) {
      uVar3 = uStack_f7c;
    }
    uVar11 = (ulong)(uVar3 - 1);
LAB_001300e3:
    pcStack_f88 = (code *)0x130101;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar8,uVar9);
    pcStack_f88 = (code *)0x130119;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R15 = (ulong)uVar3;
    pcStack_f88 = (code *)0x130134;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_00130180:
      pcStack_f88 = (code *)0x130185;
      test_bson_json_array_int64_cold_6();
LAB_00130185:
      pcStack_f88 = (code *)0x13018a;
      test_bson_json_array_int64_cold_5();
LAB_0013018a:
      pcStack_f88 = (code *)0x13018f;
      test_bson_json_array_int64_cold_2();
    }
    else {
      unaff_R12 = (undefined1 *)(ulong)uVar4;
      puVar12 = auStack_f80;
      if (uVar4 == 0xffffffff) goto LAB_00130185;
      puVar12 = (undefined1 *)(ulong)uStack_efc;
      pcStack_f88 = (code *)0x130158;
      puVar10 = (undefined1 *)write(uVar3,unaff_R14,(size_t)puVar12);
      if (puVar10 != puVar12) goto LAB_0013018a;
      unaff_R14 = (void *)(ulong)uStack_f7c;
      pcStack_f88 = (code *)0x130170;
      pvVar6 = (void *)write(uVar4,puVar5,(size_t)unaff_R14);
      if (pvVar6 == unaff_R14) {
        pcStack_f88 = (code *)0x130180;
        test_bson_json_array_int64_cold_4();
        goto LAB_00130180;
      }
    }
    pcStack_f88 = (code *)0x130194;
    test_bson_json_array_int64_cold_3();
    puStack_fa0 = puVar12;
  }
  pcStack_f88 = test_bson_json_array_subdoc;
  test_bson_json_array_int64_cold_1();
  puStack_fb0 = puVar5;
  puStack_fa8 = unaff_R12;
  pvStack_f98 = unaff_R14;
  uStack_f90 = unaff_R15;
  pcStack_f88 = (code *)&pcStack_b88;
  bson_init(auStack_1400);
  bson_init(auStack_1300);
  bson_append_int32(auStack_1300,"a",1,0x7b);
  bson_append_document(auStack_1400,"0",1,auStack_1300);
  cVar1 = bson_init_from_json(auStack_1380,"[ { \"a\" : 123 } ]",0xffffffffffffffff,auStack_1238);
  if (cVar1 == '\0') goto LAB_001303bb;
  pvVar6 = (void *)bson_get_data(auStack_1380);
  pvVar7 = (void *)bson_get_data(auStack_1400);
  if (uStack_13fc == uStack_137c) {
    __s1 = (void *)bson_get_data(auStack_1400);
    __s2 = (void *)bson_get_data(auStack_1380);
    iVar2 = bcmp(__s1,__s2,(ulong)uStack_13fc);
    if (iVar2 == 0) {
      bson_destroy(auStack_1400);
      bson_destroy(auStack_1380);
      return;
    }
  }
  uVar8 = bson_as_canonical_extended_json(auStack_1380,0);
  uVar9 = bson_as_canonical_extended_json(auStack_1400,0);
  uVar3 = uStack_13fc;
  if (uStack_137c < uStack_13fc) {
    uVar3 = uStack_137c;
  }
  if (uVar3 != 0) {
    uVar3 = uStack_13fc;
    if (uStack_137c <= uStack_13fc) {
      uVar3 = uStack_137c;
    }
    uVar11 = 0;
    do {
      if (*(char *)((long)pvVar6 + uVar11) != *(char *)((long)pvVar7 + uVar11)) {
        uVar11 = uVar11 & 0xffffffff;
        goto LAB_0013030a;
      }
      uVar11 = uVar11 + 1;
    } while (uVar3 != (uint)uVar11);
  }
  uVar3 = uStack_137c;
  if (uStack_137c < uStack_13fc) {
    uVar3 = uStack_13fc;
  }
  uVar11 = (ulong)(uVar3 - 1);
LAB_0013030a:
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar8,uVar9);
  iVar2 = open("failure.bad.bson",0x42,0x1a0);
  __fd = open("failure.expected.bson",0x42,0x1a0);
  if (iVar2 == -1) {
LAB_001303a7:
    test_bson_json_array_subdoc_cold_6();
LAB_001303ac:
    test_bson_json_array_subdoc_cold_5();
LAB_001303b1:
    test_bson_json_array_subdoc_cold_2();
  }
  else {
    if (__fd == -1) goto LAB_001303ac;
    uVar11 = write(iVar2,pvVar6,(ulong)uStack_137c);
    if (uVar11 != uStack_137c) goto LAB_001303b1;
    uVar11 = write(__fd,pvVar7,(ulong)uStack_13fc);
    if (uVar11 == uStack_13fc) {
      test_bson_json_array_subdoc_cold_4();
      goto LAB_001303a7;
    }
  }
  test_bson_json_array_subdoc_cold_3();
LAB_001303bb:
  test_bson_json_array_subdoc_cold_1();
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : \"2016-12-13T12:34:56.123Z\" } }",0x158f82db9fb);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:00.000Z\" } }",0);
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : \"1969-12-31T16:00:00.000-0800\" } }",0);
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+01:00\" } }","Could not parse");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:\" } }",
             "reached end of date while looking for seconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:+01:00\" } }","seconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:30:00.\" } }",
             "reached end of date while looking for milliseconds");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.+01:00\" } }",
             "milliseconds is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"foo-01-01T00:00:00.000Z\" } }","year must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-foo-01T00:00:00.000Z\" } }","month must be an integer"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-fooT00:00:00.000Z\" } }","day must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01Tfoo:00:00.000Z\" } }","hour must be an integer")
  ;
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:foo:00.000Z\" } }",
             "minute must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T00:00:foo.000Z\" } }",
             "seconds must be an integer");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000X\" } }","timezone is required");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+1\" } }","could not parse timezone"
            );
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+xx00\" } }",
             "could not parse timezone");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-2400\" } }",
             "timezone hour must be at most 23");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000+0060\" } }",
             "timezone minute must be at most 59");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : \"1970-01-01T01:00:00.000-0060\" } }",
             "timezone minute must be at most 59");
  return;
}

Assistant:

static void
test_bson_json_inc (void)
{
   /* test that reproduces a bug with special mode checking.  Specifically,
    * mistaking '$inc' for '$id'
    *
    * From https://github.com/mongodb/mongo-c-driver/issues/62
    */
   bson_error_t error;
   const char *json = "{ \"$inc\" : { \"ref\" : 1 } }";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   bson_destroy (&b);
}